

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMaybe.hpp
# Opt level: O0

Maybe<vkt::(anonymous_namespace)::Attachment> * __thiscall
tcu::Maybe<vkt::(anonymous_namespace)::Attachment>::operator=
          (Maybe<vkt::(anonymous_namespace)::Attachment> *this,
          Maybe<vkt::(anonymous_namespace)::Attachment> *other)

{
  Attachment *pAVar1;
  Maybe<vkt::(anonymous_namespace)::Attachment> *other_local;
  Maybe<vkt::(anonymous_namespace)::Attachment> *this_local;
  
  if (this != other) {
    if (other->m_ptr == (Attachment *)0x0) {
      this->m_ptr = (Attachment *)0x0;
    }
    else {
      pAVar1 = other->m_ptr;
      (this->field_1).m_align = *(deUint64 *)pAVar1;
      *(undefined8 *)((long)&this->field_1 + 8) = *(undefined8 *)&pAVar1->m_loadOp;
      *(undefined8 *)((long)&this->field_1 + 0x10) = *(undefined8 *)&pAVar1->m_stencilLoadOp;
      *(undefined8 *)((long)&this->field_1 + 0x18) = *(undefined8 *)&pAVar1->m_initialLayout;
      this->m_ptr = (Attachment *)&this->field_1;
    }
  }
  return this;
}

Assistant:

Maybe<T>& Maybe<T>::operator= (const Maybe<T>& other)
{
	if (this == &other)
		return *this;

	if (m_ptr)
		m_ptr->~T();

	if (other.m_ptr)
		m_ptr = new(m_data)T(*other.m_ptr);
	else
		m_ptr = DE_NULL;

	return *this;
}